

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Received_PDU.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::PDU::Resupply_Received_PDU::operator==
          (Resupply_Received_PDU *this,Resupply_Received_PDU *Value)

{
  Supplies *pSVar1;
  KBOOL KVar2;
  Supplies *this_00;
  Supplies *Value_00;
  
  KVar2 = Logistics_Header::operator!=(&this->super_Logistics_Header,&Value->super_Logistics_Header)
  ;
  if ((!KVar2) && (this->m_ui8NumSupplyTypes == Value->m_ui8NumSupplyTypes)) {
    this_00 = (this->m_vSupplies).
              super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (this->m_vSupplies).
             super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    Value_00 = (Value->m_vSupplies).
               super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pSVar1 - (long)this_00 ==
        (long)(Value->m_vSupplies).
              super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)Value_00) {
      if (this_00 == pSVar1) {
        return this_00 == pSVar1;
      }
      KVar2 = DATA_TYPE::Supplies::operator==(this_00,Value_00);
      if (KVar2) {
        do {
          Value_00 = Value_00 + 1;
          this_00 = this_00 + 1;
          if (this_00 == pSVar1) {
            return this_00 == pSVar1;
          }
          KVar2 = DATA_TYPE::Supplies::operator==(this_00,Value_00);
        } while (KVar2);
        return false;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Resupply_Received_PDU::operator == ( const Resupply_Received_PDU & Value ) const
{
    if( Logistics_Header::operator  !=( Value ) )                  return false;
    if( m_ui8NumSupplyTypes         != Value.m_ui8NumSupplyTypes ) return false;
    if( m_vSupplies                 != Value.m_vSupplies )         return false;
    return true;
}